

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O3

string * __thiscall
yactfr::internal::BeginReadScopeInstr::_toStr_abi_cxx11_
          (string *__return_storage_ptr__,BeginReadScopeInstr *this,Size indent)

{
  ostream *poVar1;
  Scope scope;
  string rProp;
  string rName;
  ostringstream ss;
  string local_268;
  char *local_248;
  long local_240;
  char local_238;
  undefined7 uStack_237;
  char *local_228;
  long local_220;
  char local_218;
  undefined7 uStack_217;
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"scope","");
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268._M_string_length = 0;
  local_268.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)&local_268,0,(char *)0x0,0x2a7a42);
  std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_1e8[0]);
  std::__cxx11::string::append((char *)&local_268);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
  (anonymous_namespace)::scopeStr_abi_cxx11_
            (&local_1c8,(_anonymous_namespace_ *)(ulong)*(uint *)&(this->super_Instr).field_0xc,
             scope);
  local_220 = 0;
  local_218 = '\0';
  local_228 = &local_218;
  std::__cxx11::string::_M_replace((ulong)&local_228,0,(char *)0x0,0x2aad13);
  std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_1c8._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_228);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_228,local_220);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"align","");
  local_240 = 0;
  local_238 = '\0';
  local_248 = &local_238;
  std::__cxx11::string::_M_replace((ulong)&local_248,0,(char *)0x0,0x2a7a42);
  std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_208[0]);
  std::__cxx11::string::append((char *)&local_248);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_248,local_240);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_248 != &local_238) {
    operator_delete(local_248,CONCAT71(uStack_237,local_238) + 1);
  }
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  Proc::toStr_abi_cxx11_(&local_268,&this->_proc,indent + 1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string BeginReadScopeInstr::_toStr(const Size indent) const
{
    std::ostringstream ss;

    ss << " " << _strProp("scope") << _strScopeName(scopeStr(_scope)) <<
          " " << _strProp("align") << _align << std::endl;
    ss << _proc.toStr(indent + 1);
    return ss.str();
}